

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFScanningDecoder.cpp
# Opt level: O0

Nullable<ZXing::Pdf417::Codeword> *
ZXing::Pdf417::DetectCodeword
          (BitMatrix *image,int minColumn,int maxColumn,bool leftToRight,int startColumn,
          int imageRow,int minCodewordWidth,int maxCodewordWidth)

{
  bool bVar1;
  int iVar2;
  int bucket;
  iterator __last;
  undefined4 in_ECX;
  undefined4 in_EDX;
  BitMatrix *in_RDI;
  byte in_R8B;
  int in_stack_00000010;
  int in_stack_00000018;
  int codeword;
  int decodedValue;
  int codewordBitCount;
  int endColumn;
  ModuleBitCountType moduleBitCount;
  undefined1 *puVar3;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  BitMatrix *moduleBitCount_00;
  Codeword local_60;
  int local_4c;
  int local_48;
  int local_40;
  int local_3c;
  undefined1 local_38 [4];
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  BitMatrix *in_stack_ffffffffffffffe0;
  int local_18;
  
  moduleBitCount_00 = in_RDI;
  iVar2 = AdjustCodewordStartColumn
                    (in_RDI,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                     SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0),
                     (int)in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  puVar3 = local_38;
  bVar1 = GetModuleBitCount(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                            in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7,
                            in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                            (ModuleBitCountType *)CONCAT44(in_EDX,in_ECX));
  if (bVar1) {
    local_40 = Reduce<std::array<int,8ul>,int,std::plus<int>>(local_38,0);
    if ((in_R8B & 1) == 0) {
      __last = std::array<int,_8UL>::begin((array<int,_8UL> *)0x2d0ffe);
      std::array<int,_8UL>::end((array<int,_8UL> *)0x2d100d);
      std::reverse<int*>(&in_RDI->_width,__last);
      local_18 = iVar2 - local_40;
      local_3c = iVar2;
    }
    else {
      local_3c = iVar2 + local_40;
      local_18 = iVar2;
    }
    bVar1 = CheckCodewordSkew(local_40,in_stack_00000010,in_stack_00000018);
    if (bVar1) {
      local_48 = CodewordDecoder::GetDecodedValue((array<int,_8UL> *)moduleBitCount_00);
      if (local_48 != -1) {
        local_4c = CodewordDecoder::GetCodeword((int)in_RDI);
        if (local_4c != -1) {
          iVar2 = local_3c;
          bucket = GetCodewordBucketNumber((int)((ulong)in_RDI >> 0x20));
          Codeword::Codeword(&local_60,local_18,iVar2,bucket,local_4c);
          Nullable<ZXing::Pdf417::Codeword>::Nullable
                    ((Nullable<ZXing::Pdf417::Codeword> *)in_RDI,&local_60);
          return (Nullable<ZXing::Pdf417::Codeword> *)moduleBitCount_00;
        }
        local_4c = 0xffffffff;
      }
      Nullable<ZXing::Pdf417::Codeword>::Nullable
                ((Nullable<ZXing::Pdf417::Codeword> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),puVar3);
    }
    else {
      Nullable<ZXing::Pdf417::Codeword>::Nullable
                ((Nullable<ZXing::Pdf417::Codeword> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),puVar3);
    }
  }
  else {
    Nullable<ZXing::Pdf417::Codeword>::Nullable
              ((Nullable<ZXing::Pdf417::Codeword> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),puVar3);
  }
  return (Nullable<ZXing::Pdf417::Codeword> *)moduleBitCount_00;
}

Assistant:

static Nullable<Codeword> DetectCodeword(const BitMatrix& image, int minColumn, int maxColumn, bool leftToRight, int startColumn, int imageRow, int minCodewordWidth, int maxCodewordWidth)
{
	startColumn = AdjustCodewordStartColumn(image, minColumn, maxColumn, leftToRight, startColumn, imageRow);
	// we usually know fairly exact now how long a codeword is. We should provide minimum and maximum expected length
	// and try to adjust the read pixels, e.g. remove single pixel errors or try to cut off exceeding pixels.
	// min and maxCodewordWidth should not be used as they are calculated for the whole barcode an can be inaccurate
	// for the current position
	ModuleBitCountType moduleBitCount;
	if (!GetModuleBitCount(image, minColumn, maxColumn, leftToRight, startColumn, imageRow, moduleBitCount)) {
		return nullptr;
	}
	int endColumn;
	int codewordBitCount = Reduce(moduleBitCount);
	if (leftToRight) {
		endColumn = startColumn + codewordBitCount;
	}
	else {
		std::reverse(moduleBitCount.begin(), moduleBitCount.end());
		endColumn = startColumn;
		startColumn = endColumn - codewordBitCount;
	}
	// TODO implement check for width and correction of black and white bars
	// use start (and maybe stop pattern) to determine if blackbars are wider than white bars. If so, adjust.
	// should probably done only for codewords with a lot more than 17 bits. 
	// The following fixes 10-1.png, which has wide black bars and small white bars
	//    for (int i = 0; i < moduleBitCount.length; i++) {
	//      if (i % 2 == 0) {
	//        moduleBitCount[i]--;
	//      } else {
	//        moduleBitCount[i]++;
	//      }
	//    }

	// We could also use the width of surrounding codewords for more accurate results, but this seems
	// sufficient for now
	if (!CheckCodewordSkew(codewordBitCount, minCodewordWidth, maxCodewordWidth)) {
		// We could try to use the startX and endX position of the codeword in the same column in the previous row,
		// create the bit count from it and normalize it to 8. This would help with single pixel errors.
		return nullptr;
	}

	int decodedValue = CodewordDecoder::GetDecodedValue(moduleBitCount);
	if (decodedValue != -1) {
		int codeword = CodewordDecoder::GetCodeword(decodedValue);
		if (codeword != -1) {
			return Codeword(startColumn, endColumn, GetCodewordBucketNumber(decodedValue), codeword);
		}
	}
	return nullptr;
}